

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

int Gia_ManSuppSizeTest(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  bool bVar5;
  abctime clk;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  clk._0_4_ = 0;
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    bVar5 = false;
    if (clk._4_4_ < p->nObjs) {
      _Counter = Gia_ManObj(p,clk._4_4_);
      bVar5 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_Counter);
    if (iVar1 != 0) {
      iVar1 = Gia_ManSuppSizeOne(p,_Counter);
      clk._0_4_ = (iVar1 < 0x11) + (uint)clk;
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
  uVar2 = Gia_ManAndNum(p);
  printf("Nodes with small support %d (out of %d)\n",(ulong)(uint)clk,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return (uint)clk;
}

Assistant:

int Gia_ManSuppSizeTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            Counter += (Gia_ManSuppSizeOne(p, pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Gia_ManAndNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}